

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  istream *piVar1;
  double __x;
  Experiment local_241;
  undefined1 local_240 [7];
  Experiment experiment;
  ofstream out;
  string local_30 [8];
  string s;
  ushort local_c;
  ushort local_a [3];
  Short step;
  Short k;
  
  std::__cxx11::string::string(local_30);
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,local_a);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&local_c);
  std::operator>>(piVar1,local_30);
  std::ofstream::ofstream(local_240,local_30,0x10);
  Experiment::Experiment(&local_241);
  Experiment::exp(&local_241,__x);
  Experiment::~Experiment(&local_241);
  std::ofstream::~ofstream(local_240);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main()
{
    Num::Short k;
    Num::Short step;
    std::string s;

    std::cin>>k>>step>>s;
    std::ofstream out(s);

    Experiment experiment;
    experiment.exp(k,step, out);
}